

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zarray.h
# Opt level: O0

void zarray_add(zarray_t *za,void *p)

{
  void *p_local;
  zarray_t *za_local;
  
  if (za == (zarray_t *)0x0) {
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                  ,0xb5,"void zarray_add(zarray_t *, const void *)");
  }
  if (p != (void *)0x0) {
    zarray_ensure_capacity(za,za->size + 1);
    memcpy(za->data + (long)za->size * za->el_sz,p,za->el_sz);
    za->size = za->size + 1;
    return;
  }
  __assert_fail("p != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                ,0xb6,"void zarray_add(zarray_t *, const void *)");
}

Assistant:

static inline void zarray_add(zarray_t *za, const void *p)
{
    assert(za != NULL);
    assert(p != NULL);

    zarray_ensure_capacity(za, za->size + 1);

    memcpy(&za->data[za->size*za->el_sz], p, za->el_sz);
    za->size++;
}